

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCreateTable(Btree *p,int *piTable,int flags)

{
  int iVar1;
  int rc;
  int flags_local;
  int *piTable_local;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  iVar1 = btreeCreateTable(p,piTable,flags);
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, int *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}